

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O0

vector_t **** gauden_alloc_param_full(uint32 n_cb,uint32 n_feat,uint32 n_density,uint32 *veclen)

{
  vector_t ****pppppfVar1;
  void *pvVar2;
  uint local_4c;
  uint local_48;
  uint32 m;
  uint32 l;
  uint32 k;
  uint32 j;
  uint32 i;
  float32 *buf;
  vector_t ****param;
  uint32 maxveclen;
  uint32 blksize;
  uint32 *veclen_local;
  uint32 n_density_local;
  uint32 n_feat_local;
  uint32 n_cb_local;
  
  param._4_4_ = 0;
  param._0_4_ = 0;
  for (l = 0; l < n_feat; l = l + 1) {
    param._4_4_ = veclen[l] + param._4_4_;
    if ((uint32)param < veclen[l]) {
      param._0_4_ = veclen[l];
    }
  }
  pppppfVar1 = (vector_t ****)
               __ckd_calloc_4d__((ulong)n_cb,(ulong)n_feat,(ulong)n_density,(ulong)(uint32)param,8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                                 ,0xf4);
  pvVar2 = __ckd_calloc__((ulong)(n_cb * n_density * param._4_4_ * param._4_4_),4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                          ,0xf7);
  local_4c = 0;
  for (k = 0; k < n_cb; k = k + 1) {
    for (l = 0; l < n_feat; l = l + 1) {
      for (m = 0; m < n_density; m = m + 1) {
        for (local_48 = 0; local_48 < veclen[l]; local_48 = local_48 + 1) {
          pppppfVar1[k][l][m][local_48] = (vector_t)((long)pvVar2 + (ulong)local_4c * 4);
          local_4c = veclen[l] + local_4c;
        }
      }
    }
  }
  return pppppfVar1;
}

Assistant:

vector_t ****
gauden_alloc_param_full(uint32 n_cb,
			uint32 n_feat,
			uint32 n_density,
			const uint32 *veclen)
{
    uint32 blksize, maxveclen;
    vector_t ****param;
    float32 *buf;
    uint32 i, j, k, l, m;

    for (blksize = 0, maxveclen = 0, j = 0; j < n_feat; j++) {
	blksize += veclen[j];
	if (veclen[j] > maxveclen) maxveclen = veclen[j];
    }

    param = (vector_t ****) ckd_calloc_4d(n_cb, n_feat, n_density,
					  maxveclen, sizeof(vector_t));
    
    buf = ckd_calloc(n_cb * n_density * blksize * blksize,
		     sizeof(float32));

    for (i = 0, m = 0; i < n_cb; i++) {
	for (j = 0; j < n_feat; j++) {
	    for (k = 0; k < n_density; k++) {
		for (l = 0; l < veclen[j]; l++) {
		    param[i][j][k][l] = &buf[m];

		    m += veclen[j];
		}
	    }
	}
    }
    
    return param;
}